

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O1

void __thiscall KktCheck::printAR(KktCheck *this)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  int iVar4;
  undefined8 in_RAX;
  ostream *poVar5;
  pointer pdVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  char *pcVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  char buff [4];
  undefined8 local_38;
  
  local_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"N=",2);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->numCol);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,",  M=",5);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->numRow);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,",  NZ= ",7);
  poVar5 = (ostream *)
           std::ostream::operator<<
                     (poVar5,(this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[this->numRow]);
  local_38 = CONCAT17(10,(undefined7)local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)((long)&local_38 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n-----cost-----\n",0x10);
  pdVar6 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar6) {
    uVar14 = 0;
    do {
      sprintf((char *)&local_38,"%2.1g ",pdVar6[uVar14]);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar7 = strlen((char *)&local_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)&local_38,sVar7);
      uVar14 = uVar14 + 1;
      pdVar6 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)((long)(this->colCost).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar6 >> 3));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------AR | b----KktCheck-\n",0x1a);
  this->i = 0;
  if (0 < this->numRow) {
    do {
      this->j = 0;
      if (0 < this->numCol) {
        iVar13 = 0;
        do {
          lVar8 = (long)this->i;
          piVar2 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar3 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar11 = piVar2[lVar8];
          lVar9 = (long)iVar11;
          bVar15 = piVar3[lVar9] == iVar13;
          if (bVar15) {
LAB_0014f03c:
            if (piVar2[lVar8 + 1] <= iVar11) goto LAB_0014f07e;
            sprintf((char *)&local_38,"%2.1g ",
                    (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar9]);
            *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
            sVar7 = strlen((char *)&local_38);
            pcVar12 = (char *)&local_38;
          }
          else {
            iVar1 = piVar2[lVar8 + 1];
            iVar4 = iVar1;
            if (iVar1 < iVar11) {
              iVar4 = iVar11;
            }
            if (iVar11 < iVar1) {
              lVar10 = lVar9;
              do {
                iVar11 = iVar11 + 1;
                lVar9 = lVar10 + 1;
                bVar15 = piVar3[lVar10 + 1] == iVar13;
                if (bVar15) goto LAB_0014f03c;
                lVar10 = lVar9;
              } while (iVar4 != lVar9);
            }
            iVar11 = (int)lVar9;
            if (bVar15) goto LAB_0014f03c;
LAB_0014f07e:
            *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
            sVar7 = 3;
            pcVar12 = "   ";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,sVar7);
          iVar13 = this->j + 1;
          this->j = iVar13;
        } while (iVar13 < this->numCol);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  |   ",6);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      poVar5 = std::ostream::_M_insert<double>
                         ((this->rowLower).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[this->i]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," < < ",5);
      poVar5 = std::ostream::_M_insert<double>
                         ((this->rowUpper).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[this->i]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      iVar13 = this->i + 1;
      this->i = iVar13;
    } while (iVar13 < this->numRow);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------l------\n",0xe);
  if (0 < this->numCol) {
    lVar8 = 0;
    do {
      if ((this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar8] <= -1e+200) {
        local_38._4_4_ = (uint)((ulong)local_38 >> 0x20) & 0xffffff00;
        local_38 = CONCAT44(local_38._4_4_,0x666e692d);
      }
      else {
        sprintf((char *)&local_38,"%2.1g ");
      }
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar7 = strlen((char *)&local_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)&local_38,sVar7);
      lVar8 = lVar8 + 1;
    } while (lVar8 < this->numCol);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------u------\n",0xe);
  if (0 < this->numCol) {
    lVar8 = 0;
    do {
      if (1e+200 <= (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar8]) {
        local_38 = CONCAT44(local_38._4_4_,0x666e69);
      }
      else {
        sprintf((char *)&local_38,"%2.1g ");
      }
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar7 = strlen((char *)&local_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)&local_38,sVar7);
      lVar8 = lVar8 + 1;
    } while (lVar8 < this->numCol);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  return;
}

Assistant:

void KktCheck::printAR() {
	cout<<"N="<<numCol<<",  M="<<numRow<<",  NZ= "<<ARstart[numRow]<<'\n';	

	char buff [4];
	cout<<"\n-----cost-----\n";
	for (size_t i=0;i<colCost.size();i++) {
		sprintf(buff, "%2.1g ", colCost[i]);
		cout<<std::setw(5)<<buff; 
	}
	cout<<endl;
	cout<<"------AR | b----KktCheck-\n";
	for (i=0;i<numRow;i++) {
		for (j=0;j<numCol;j++) {

			int ind = ARstart[i];
			while (ARindex[ind]!=j && ind<ARstart[i+1])
				ind++;
			//if a_ij is nonzero print
			if (ARindex[ind]==j && ind<ARstart[i+1])
			{	
				sprintf(buff, "%2.1g ", ARvalue[ind]);
				cout<<std::setw(5)<<buff; 
				}
			else cout<<std::setw(5)<<"   ";
		
		}
		cout<<"  |   "<<std::setw(5)<<rowLower[i]<<" < < "<<rowUpper[i]<<endl;
	}
	cout<<endl;
	cout<<"------l------\n";
	for (int i=0;i<numCol;i++) { 
		if (colLower[i]>-HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colLower[i]);
		else 
			sprintf(buff, "-inf");
		cout<<setw(5)<<buff; 
	}
	cout<<endl;
	cout<<"------u------\n";
	for (int i=0;i<numCol;i++) { 
		if (colUpper[i]<HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colUpper[i]);
		else 
			sprintf(buff, "inf");
		cout<<setw(5)<<buff; 
	}
	cout<<endl;
}